

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O3

void InstructionSet::M68k::Primitive::add_sub<true,true,unsigned_short>
               (unsigned_short source,unsigned_short *destination,Status *status)

{
  ushort uVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  ushort uVar4;
  FlagT FVar5;
  bool bVar6;
  uint uVar7;
  undefined1 auVar8 [14];
  undefined1 auVar9 [16];
  
  uVar1 = *destination;
  uVar4 = uVar1 + source;
  FVar5 = (FlagT)CARRY2(uVar1,source);
  status->carry_flag = FVar5;
  if (status->extend_flag != 0) {
    bVar6 = uVar4 < uVar1;
    uVar4 = uVar4 + 1;
    FVar5 = (FlagT)(uVar4 == 0 || bVar6);
    status->carry_flag = FVar5;
  }
  status->extend_flag = FVar5;
  status->zero_result = status->zero_result | (ulong)uVar4;
  auVar8._8_6_ = 0;
  auVar8._0_8_ = (ulong)(~(source ^ uVar1) & 0x8000) | 0x80000000;
  auVar8 = auVar8 & ZEXT414(CONCAT22(uVar4,uVar4 ^ uVar1));
  uVar7 = auVar8._0_4_;
  auVar2._4_2_ = auVar8._2_2_;
  auVar2._0_4_ = uVar7;
  auVar2._6_8_ = SUB148(ZEXT214(0) << 0x40,6);
  auVar3._4_10_ = auVar2._4_10_;
  auVar3._0_4_ = uVar7 & 0xffff;
  auVar9._0_8_ = auVar3._0_8_ & 0xffffffff;
  auVar9._8_4_ = auVar2._4_4_;
  auVar9._12_4_ = 0;
  status->overflow_flag = auVar9._0_8_;
  status->negative_flag = auVar9._8_8_;
  *destination = uVar4;
  return;
}

Assistant:

static void add_sub(IntT source, IntT &destination, Status &status) {
	static_assert(!std::numeric_limits<IntT>::is_signed);

	IntT result = is_add ?
		destination + source :
		destination - source;
	status.carry_flag = is_add ? result < destination : result > destination;

	// If this is an extend operation, there's a second opportunity to create carry,
	// which requires a second test.
	if(is_extend && status.extend_flag) {
		if constexpr (is_add) {
			++result;
			status.carry_flag |= result == 0;
		} else {
			status.carry_flag |= result == 0;
			--result;
		}
	}
	status.extend_flag = status.carry_flag;

	// Extend operations can reset the zero flag only; non-extend operations
	// can either set it or reset it. Which in the reverse-logic world of
	// zero_result means ORing or storing.
	if constexpr (is_extend) {
		status.zero_result |= Status::FlagT(result);
	} else {
		status.zero_result = Status::FlagT(result);
	}
	status.set_negative(result);
	status.overflow_flag = Numeric::overflow<is_add>(destination, source, result);
	destination = result;
}